

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O1

void __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
UnPop<UnifiedRegex::RewindLoopSetWithFollowFirstCont>
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->super_ContinuousPageStack<1UL>).bufferSize <
      (this->super_ContinuousPageStack<1UL>).nextTop + 0x18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x107,"(nextTop + size <= bufferSize)","nextTop + size <= bufferSize");
    if (!bVar3) goto LAB_00f06f25;
    *puVar4 = 0;
  }
  uVar1 = (this->super_ContinuousPageStack<1UL>).nextTop;
  (this->super_ContinuousPageStack<1UL>).nextTop = uVar1 + 0x18;
  if (0xffffffffffffffe7 < uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0xf0,"(size <= nextTop)","size <= nextTop");
    if (!bVar3) goto LAB_00f06f25;
    *puVar4 = 0;
  }
  if ((this->super_ContinuousPageStack<1UL>).bufferSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar3) goto LAB_00f06f25;
    *puVar4 = 0;
  }
  if (*(size_t *)
       ((long)(this->super_ContinuousPageStack<1UL>).pageAllocation +
       ((this->super_ContinuousPageStack<1UL>).nextTop - 8)) != this->topElementSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x207,
                       "(reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template Size<ActualT>()))->PreviousElementSize() == topElementSize)"
                       ,
                       "reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template Size<ActualT>()))->PreviousElementSize() == topElementSize"
                      );
    if (!bVar3) {
LAB_00f06f25:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this->topElementSize = 0x18;
  return;
}

Assistant:

inline void ContinuousPageStackOfVariableElements<T, InitialPageCount>::UnPop()
{
    TemplateParameter::SameOrDerivedFrom<ActualT, T>(); // ActualT must be the same type as, or a type derived from, T
    ContinuousPageStack<InitialPageCount>::UnPop(VariableElement::template
    Size<ActualT>());
    Assert(reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template
    Size<ActualT>()))->PreviousElementSize() == topElementSize);
    topElementSize = VariableElement::template Size<ActualT>();
}